

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void dg::dda::recGatherNonPhisDefs
               (RWNode *phi,SparseBitvectorHashImpl *phis,SparseBitvectorHashImpl *ret,
               bool intraproc)

{
  RWNode *pRVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  iterator this;
  iterator i;
  reference ppRVar5;
  byte in_CL;
  RWNode *in_RDX;
  RWNode *in_RSI;
  long in_RDI;
  RWNode *n;
  iterator __end2;
  iterator __begin2;
  DefUses *__range2;
  RWNode *in_stack_ffffffffffffffa8;
  RWNode *pRVar6;
  RWNode *in_stack_ffffffffffffffb0;
  unsigned_long in_stack_ffffffffffffffc8;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  RWNode *pRVar7;
  
  bVar2 = in_CL & 1;
  SubgraphNode<dg::dda::RWNode>::getID((SubgraphNode<dg::dda::RWNode> *)(in_RDI + 8));
  bVar3 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::set((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                 *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8);
  if (!bVar3) {
    lVar4 = in_RDI + 0x130;
    this = RWNode::DefUses::begin((DefUses *)in_stack_ffffffffffffffa8);
    i = RWNode::DefUses::end((DefUses *)in_stack_ffffffffffffffa8);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                               *)in_stack_ffffffffffffffa8), bVar3) {
      ppRVar5 = __gnu_cxx::
                __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                ::operator*((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                             *)&stack0xffffffffffffffd0);
      pRVar1 = *ppRVar5;
      bVar3 = RWNode::isPhi(in_stack_ffffffffffffffb0);
      pRVar7 = in_RDX;
      if (bVar3) {
        if (((bVar2 & 1) == 0) ||
           (pRVar6 = in_RDX, bVar3 = RWNode::isInOut(in_stack_ffffffffffffffb0), pRVar7 = pRVar6,
           !bVar3)) {
          pRVar6 = in_stack_ffffffffffffffa8;
          recGatherNonPhisDefs
                    (in_RSI,(SparseBitvectorHashImpl *)pRVar7,
                     (SparseBitvectorHashImpl *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                     SUB81((ulong)lVar4 >> 0x38,0));
        }
        else {
          SubgraphNode<dg::dda::RWNode>::getID(&pRVar1->super_SubgraphNode<dg::dda::RWNode>);
          ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::set((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                 *)this._M_current,(unsigned_long)i._M_current);
        }
      }
      else {
        SubgraphNode<dg::dda::RWNode>::getID(&pRVar1->super_SubgraphNode<dg::dda::RWNode>);
        ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
        ::set((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
               *)this._M_current,(unsigned_long)i._M_current);
        pRVar6 = in_stack_ffffffffffffffa8;
        in_stack_ffffffffffffffb0 = in_RDX;
      }
      __gnu_cxx::
      __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
      ::operator++((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                    *)&stack0xffffffffffffffd0);
      in_stack_ffffffffffffffa8 = pRVar6;
      in_RDX = pRVar7;
    }
  }
  return;
}

Assistant:

static void recGatherNonPhisDefs(RWNode *phi,
                                 dg::ADT::SparseBitvectorHashImpl &phis,
                                 dg::ADT::SparseBitvectorHashImpl &ret,
                                 bool intraproc = false) {
    assert(phi->isPhi());
    // set returns the previous value, so if its 'true',
    // we already had the phi
    if (phis.set(phi->getID()))
        return; // we already visited this phi

    for (auto *n : phi->defuse) {
        if (!n->isPhi()) {
            ret.set(n->getID());
        } else {
            if (intraproc && n->isInOut()) {
                ret.set(n->getID());
            } else {
                recGatherNonPhisDefs(n, phis, ret, intraproc);
            }
        }
    }
}